

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O1

void __thiscall
Ptex::v2_2::PtexReader::getData(PtexReader *this,int faceid,void *buffer,int stride,Res res)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  undefined2 uVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  void *pvVar9;
  long *plVar10;
  void *src;
  EVP_PKEY_CTX *pEVar11;
  byte bVar12;
  uint uVar13;
  undefined4 in_register_00000034;
  int iVar14;
  undefined6 in_register_00000082;
  int iVar15;
  int iVar16;
  long *plVar8;
  
  bVar2 = res.vlog2;
  bVar1 = res.ulog2;
  if (((-1 < faceid) && (this->_ok != false)) && ((uint)faceid < (this->_header).nfaces)) {
    uVar13 = this->_pixelsize << (bVar1 & 0x1f);
    if (stride == 0) {
      stride = uVar13;
    }
    iVar6 = (*(this->super_PtexTexture)._vptr_PtexTexture[0x14])
                      (this,CONCAT44(in_register_00000034,faceid),
                       CONCAT62(in_register_00000082,res) & 0xffffffff);
    plVar8 = (long *)CONCAT44(extraout_var,iVar6);
    cVar4 = (**(code **)(*plVar8 + 0x18))(plVar8);
    if (cVar4 == '\0') {
      cVar4 = (**(code **)(*plVar8 + 0x38))(plVar8);
      if (cVar4 == '\0') {
        pEVar11 = (EVP_PKEY_CTX *)(**(code **)(*plVar8 + 0x30))(plVar8);
        PtexUtils::copy(pEVar11,(EVP_PKEY_CTX *)(ulong)uVar13);
      }
      else {
        uVar5 = (**(code **)(*plVar8 + 0x40))(plVar8);
        bVar3 = (byte)((ushort)uVar5 >> 8);
        bVar12 = (byte)uVar5;
        uVar13 = this->_pixelsize << (bVar12 & 0x1f);
        if ((int)(char)bVar2 - (int)(char)bVar3 != 0x1f) {
          iVar14 = 1 << ((byte)((int)(char)bVar2 - (int)(char)bVar3) & 0x1f);
          iVar6 = 1 << ((byte)((int)(char)bVar1 - (int)(char)bVar12) & 0x1f);
          if (iVar6 < 2) {
            iVar6 = 1;
          }
          if (iVar14 < 2) {
            iVar14 = 1;
          }
          iVar7 = 0;
          iVar15 = 0;
          do {
            pvVar9 = buffer;
            iVar16 = iVar6;
            if ((int)(char)bVar1 - (int)(char)bVar12 != 0x1f) {
              do {
                plVar10 = (long *)(**(code **)(*plVar8 + 0x48))(plVar8,iVar15);
                cVar4 = (**(code **)(*plVar10 + 0x18))(plVar10);
                if (cVar4 == '\0') {
                  pEVar11 = (EVP_PKEY_CTX *)(**(code **)(*plVar10 + 0x30))(plVar10);
                  PtexUtils::copy(pEVar11,(EVP_PKEY_CTX *)(ulong)uVar13);
                }
                else {
                  src = (void *)(**(code **)(*plVar10 + 0x30))(plVar10);
                  PtexUtils::fill(src,pvVar9,stride,1 << (bVar12 & 0x1f),1 << (bVar3 & 0x1f),
                                  this->_pixelsize);
                }
                (**(code **)(*plVar10 + 0x10))(plVar10);
                pvVar9 = (void *)((long)pvVar9 + (long)(int)uVar13);
                iVar15 = iVar15 + 1;
                iVar16 = iVar16 + -1;
              } while (iVar16 != 0);
            }
            buffer = (void *)((long)buffer + (long)(stride << (bVar3 & 0x1f)));
            iVar7 = iVar7 + 1;
          } while (iVar7 != iVar14);
        }
      }
    }
    else {
      pvVar9 = (void *)(**(code **)(*plVar8 + 0x30))(plVar8);
      PtexUtils::fill(pvVar9,buffer,stride,1 << (bVar1 & 0x1f),1 << (bVar2 & 0x1f),this->_pixelsize)
      ;
    }
    (**(code **)(*plVar8 + 0x10))(plVar8);
    return;
  }
  PtexUtils::fill((this->_errorPixel).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,buffer,stride,1 << (bVar1 & 0x1f),
                  1 << (bVar2 & 0x1f),this->_pixelsize);
  return;
}

Assistant:

void PtexReader::getData(int faceid, void* buffer, int stride, Res res)
{
    if (!_ok || faceid < 0 || size_t(faceid) >= _header.nfaces) {
        PtexUtils::fill(&_errorPixel[0], buffer, stride, res.u(), res.v(), _pixelsize);
        return;
    }

    // note - all locking is handled in called getData methods
    int resu = res.u(), resv = res.v();
    int rowlen = _pixelsize * resu;
    if (stride == 0) stride = rowlen;

    PtexPtr<PtexFaceData> d ( getData(faceid, res) );
    if (d->isConstant()) {
        // fill dest buffer with pixel value
        PtexUtils::fill(d->getData(), buffer, stride,
                        resu, resv, _pixelsize);
    }
    else if (d->isTiled()) {
        // loop over tiles
        Res tileres = d->tileRes();
        int ntilesu = res.ntilesu(tileres);
        int ntilesv = res.ntilesv(tileres);
        int tileures = tileres.u();
        int tilevres = tileres.v();
        int tilerowlen = _pixelsize * tileures;
        int tile = 0;
        char* dsttilerow = (char*) buffer;
        for (int i = 0; i < ntilesv; i++) {
            char* dsttile = dsttilerow;
            for (int j = 0; j < ntilesu; j++) {
                PtexPtr<PtexFaceData> t ( d->getTile(tile++) );
                if (t->isConstant())
                    PtexUtils::fill(t->getData(), dsttile, stride,
                                    tileures, tilevres, _pixelsize);
                else
                    PtexUtils::copy(t->getData(), tilerowlen, dsttile, stride,
                                    tilevres, tilerowlen);
                dsttile += tilerowlen;
            }
            dsttilerow += stride * tilevres;
        }
    }
    else {
        PtexUtils::copy(d->getData(), rowlen, buffer, stride, resv, rowlen);
    }
}